

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::MergeFromInternal
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other,
          offset_in_RepeatedPtrFieldBase_to_subr inner_loop)

{
  int extend_amount;
  Rep *pRVar1;
  void **ppvVar2;
  long in_RCX;
  long *plVar3;
  code *local_78;
  int allocated_elems;
  void **new_elements;
  void **other_elements;
  int other_size;
  offset_in_RepeatedPtrFieldBase_to_subr inner_loop_local;
  RepeatedPtrFieldBase *other_local;
  RepeatedPtrFieldBase *this_local;
  
  extend_amount = other->current_size_;
  pRVar1 = other->rep_;
  ppvVar2 = InternalExtend(this,extend_amount);
  plVar3 = (long *)((long)&this->arena_ + in_RCX);
  local_78 = (code *)inner_loop;
  if ((inner_loop & 1) != 0) {
    local_78 = *(code **)(*plVar3 + (inner_loop - 1));
  }
  (*local_78)(plVar3,ppvVar2,pRVar1->elements,extend_amount,
              this->rep_->allocated_size - this->current_size_);
  this->current_size_ = extend_amount + this->current_size_;
  if (this->rep_->allocated_size < this->current_size_) {
    this->rep_->allocated_size = this->current_size_;
  }
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::MergeFromInternal(
    const RepeatedPtrFieldBase& other,
    void (RepeatedPtrFieldBase::*inner_loop)(void**, void**, int, int)) {
  // Note: wrapper has already guaranteed that other.rep_ != NULL here.
  int other_size = other.current_size_;
  void** other_elements = other.rep_->elements;
  void** new_elements = InternalExtend(other_size);
  int allocated_elems = rep_->allocated_size - current_size_;
  (this->*inner_loop)(new_elements, other_elements,
                      other_size, allocated_elems);
  current_size_ += other_size;
  if (rep_->allocated_size < current_size_) {
    rep_->allocated_size = current_size_;
  }
}